

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O0

void free_engravings(level *lev)

{
  engr *peVar1;
  engr *local_20;
  engr *ep;
  engr *ep2;
  level *lev_local;
  
  local_20 = lev->lev_engr;
  while (local_20 != (engr *)0x0) {
    peVar1 = local_20->nxt_engr;
    free(local_20);
    local_20 = peVar1;
  }
  lev->lev_engr = (engr *)0x0;
  return;
}

Assistant:

void free_engravings(struct level *lev)
{
	struct engr *ep2, *ep = lev->lev_engr;
	
	while (ep) {
	    ep2 = ep->nxt_engr;
	    dealloc_engr(ep);
	    ep = ep2;
	}
	lev->lev_engr = NULL;
}